

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void prepare_close_job_string
               (cio_websocket *websocket,cio_websocket_status_code status_code,char *reason,
               cio_websocket_write_handler_t handler,void *handler_context,
               cio_buffered_stream_write_handler_t stream_handler)

{
  size_t reason_length;
  
  if (reason == (char *)0x0) {
    reason_length = 0;
  }
  else {
    reason_length = strlen(reason);
  }
  prepare_close_job(websocket,status_code,(uint8_t *)reason,reason_length,handler,handler_context,
                    stream_handler);
  return;
}

Assistant:

static void prepare_close_job_string(struct cio_websocket *websocket, enum cio_websocket_status_code status_code, const char *reason, cio_websocket_write_handler_t handler, void *handler_context, cio_buffered_stream_write_handler_t stream_handler)
{
	size_t length = 0;

	if (reason != NULL) {
		length = strlen(reason);
	}

	prepare_close_job(websocket, status_code, (const uint8_t *)reason, length, handler, handler_context, stream_handler);
}